

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

p_ply_conflict ply_open(char *name,p_ply_error_cb error_cb,long idata,void *pdata)

{
  FILE *__stream;
  long in_RCX;
  p_ply_error_cb in_RDX;
  code *in_RSI;
  char *in_RDI;
  p_ply_conflict ply;
  FILE *fp;
  p_ply_conflict local_8;
  
  if ((FILE *)in_RSI == (FILE *)0x0) {
    in_RSI = ply_error_cb;
  }
  __stream = fopen(in_RDI,"rb");
  if (__stream == (FILE *)0x0) {
    (*in_RSI)(0,"Unable to open file");
    local_8 = (p_ply_conflict)0x0;
  }
  else {
    local_8 = ply_open_from_file((FILE *)in_RSI,in_RDX,in_RCX,__stream);
    if (local_8 == (p_ply_conflict)0x0) {
      fclose(__stream);
    }
    else {
      local_8->own_fp = 1;
    }
  }
  return local_8;
}

Assistant:

p_ply ply_open(const char *name, p_ply_error_cb error_cb,
        long idata, void *pdata) {
    FILE *fp;
    p_ply ply;
    if (error_cb == NULL) error_cb = ply_error_cb;
    assert(name);
    fp = fopen(name, "rb");
    if (!fp) {
        error_cb(NULL, "Unable to open file");
        return NULL;
    }
    ply = ply_open_from_file(fp, error_cb, idata, pdata);
    if (ply) ply->own_fp = 1;
    else fclose(fp);
    return ply;
}